

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void while_stmt(Vm *vm)

{
  uint64_t address;
  uint64_t offset;
  uint64_t offset_00;
  uint64_t to_start;
  uint64_t exit_jmp;
  uint64_t start_instruction;
  Vm *vm_local;
  
  advance(vm);
  address = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
  expr(vm);
  offset = emit_jump(vm,OP_JMF);
  loop_body(vm);
  offset_00 = emit_jump(vm,OP_JMP);
  patch_jump_to(vm,offset_00,address);
  patch_jump_to(vm,offset,((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count);
  return;
}

Assistant:

static void while_stmt(Vm *vm) {
    advance(vm);
    uint64_t start_instruction = CURR_FRAME(vm)->code_buffer.count;
    expr(vm);

    uint64_t exit_jmp = emit_jump(vm, OP_JMF);
    loop_body(vm);

    uint64_t to_start = emit_jump(vm, OP_JMP);
    patch_jump_to(vm, to_start, start_instruction);
    patch_jump_to(vm, exit_jmp, CURR_FRAME(vm)->code_buffer.count);
}